

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O3

void __thiscall aeron::archive::AeronArchive::checkForErrorResponse(AeronArchive *this)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  Value VVar4;
  int64_t iVar5;
  SourcedException *this_00;
  string *__rhs;
  long *plVar6;
  char *pcVar7;
  int in_ECX;
  size_type *psVar8;
  nfds_t __nfds;
  pollfd *in_RSI;
  char *pcVar9;
  unique_lock<std::mutex> lock;
  allocator local_f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  unique_lock<std::mutex> local_b8;
  string local_a8;
  string local_88;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  local_b8._M_device = &this->lock_;
  local_b8._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_b8);
  local_b8._M_owns = true;
  iVar3 = ControlResponsePoller::poll
                    ((this->controlResponsePoller_)._M_t.
                     super___uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_aeron::archive::ControlResponsePoller_*,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                     .super__Head_base<0UL,_aeron::archive::ControlResponsePoller_*,_false>.
                     _M_head_impl,in_RSI,__nfds,in_ECX);
  if (iVar3 != 0) {
    bVar2 = ControlResponsePoller::isPollComplete
                      ((this->controlResponsePoller_)._M_t.
                       super___uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_aeron::archive::ControlResponsePoller_*,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                       .super__Head_base<0UL,_aeron::archive::ControlResponsePoller_*,_false>.
                       _M_head_impl);
    if (bVar2) {
      iVar5 = ControlResponsePoller::controlSessionId
                        ((this->controlResponsePoller_)._M_t.
                         super___uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_aeron::archive::ControlResponsePoller_*,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                         .super__Head_base<0UL,_aeron::archive::ControlResponsePoller_*,_false>.
                         _M_head_impl);
      if (iVar5 == this->controlSessionId_) {
        iVar5 = ControlResponsePoller::templateId
                          ((this->controlResponsePoller_)._M_t.
                           super___uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_aeron::archive::ControlResponsePoller_*,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                           .super__Head_base<0UL,_aeron::archive::ControlResponsePoller_*,_false>.
                           _M_head_impl);
        if (iVar5 == 1) {
          VVar4 = ControlResponsePoller::code
                            ((this->controlResponsePoller_)._M_t.
                             super___uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_aeron::archive::ControlResponsePoller_*,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                             .super__Head_base<0UL,_aeron::archive::ControlResponsePoller_*,_false>.
                             _M_head_impl);
          if (VVar4 == ERROR) {
            this_00 = (SourcedException *)__cxa_allocate_exception(0x48);
            __rhs = ControlResponsePoller::errorMessage_abi_cxx11_
                              ((this->controlResponsePoller_)._M_t.
                               super___uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_aeron::archive::ControlResponsePoller_*,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                               .
                               super__Head_base<0UL,_aeron::archive::ControlResponsePoller_*,_false>
                               ._M_head_impl);
            std::operator+(&local_d8,"error: ",__rhs);
            plVar6 = (long *)std::__cxx11::string::append((char *)&local_d8);
            local_f8._M_dataplus._M_p = (pointer)*plVar6;
            psVar8 = (size_type *)(plVar6 + 2);
            if ((size_type *)local_f8._M_dataplus._M_p == psVar8) {
              local_f8.field_2._M_allocated_capacity = *psVar8;
              local_f8.field_2._8_8_ = plVar6[3];
              local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
            }
            else {
              local_f8.field_2._M_allocated_capacity = *psVar8;
            }
            local_f8._M_string_length = plVar6[1];
            *plVar6 = (long)psVar8;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            iVar5 = ControlResponsePoller::relevantId
                              ((this->controlResponsePoller_)._M_t.
                               super___uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_aeron::archive::ControlResponsePoller_*,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                               .
                               super__Head_base<0UL,_aeron::archive::ControlResponsePoller_*,_false>
                               ._M_head_impl);
            std::__cxx11::to_string(&local_68,iVar5);
            std::operator+(&local_48,&local_f8,&local_68);
            local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_a8,
                       "void aeron::archive::AeronArchive::checkForErrorResponse()","");
            pcVar9 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp"
            ;
            pcVar7 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
            ;
            do {
              pcVar7 = pcVar7 + 1;
              pcVar1 = pcVar9 + 1;
              pcVar9 = pcVar9 + 1;
            } while (*pcVar7 == *pcVar1);
            std::__cxx11::string::string((string *)&local_88,pcVar9 + (*pcVar1 == '/'),&local_f9);
            aeron::util::SourcedException::SourcedException
                      (this_00,&local_48,&local_a8,&local_88,0x73);
            *(undefined ***)this_00 = &PTR__SourcedException_00163260;
            __cxa_throw(this_00,&ArchiveException::typeinfo,
                        aeron::util::SourcedException::~SourcedException);
          }
        }
      }
    }
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_b8);
  return;
}

Assistant:

void AeronArchive::checkForErrorResponse() {
    std::unique_lock<std::mutex> lock(lock_);

    if (controlResponsePoller_->poll() != 0 && controlResponsePoller_->isPollComplete()) {
        if (controlResponsePoller_->controlSessionId() == controlSessionId_ &&
            controlResponsePoller_->templateId() == codecs::ControlResponse::sbeTemplateId() &&
            controlResponsePoller_->code() == codecs::ControlResponseCode::ERROR) {
            throw ArchiveException("error: " + controlResponsePoller_->errorMessage() +
                                       ", relevant id: " + std::to_string(controlResponsePoller_->relevantId()),
                                   SOURCEINFO);
        }
    }
}